

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::
Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
convert(Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
        *this,Boxed_Value *t_from)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  
  if (t_from[4].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)t_from[5].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              (this,&t_from[3].m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar1.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool bidir() const noexcept override { return false; }